

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall
soul::heart::Printer::PrinterStream::buildLocalVariableList(PrinterStream *this,Function *f)

{
  pool_ref<soul::heart::Variable> *ppVar1;
  size_t sVar2;
  bool bVar3;
  string *__x;
  mapped_type *pmVar4;
  pointer __k;
  int __val;
  long lVar5;
  int local_134;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usedNames;
  string name;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  localVars;
  anon_class_16_2_a56975aa local_c0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  _Hashtable<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->localVariableNames)._M_h);
  Function::getAllLocalVariables(&localVars,f);
  usedNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  usedNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  usedNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&usedNames,
            (long)localVars.
                  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)localVars.
                  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar1 = (f->parameters).items;
  sVar2 = (f->parameters).numActive;
  for (lVar5 = 0; sVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
    __x = Identifier::toString_abi_cxx11_
                    ((Identifier *)(*(long *)((long)&ppVar1->object + lVar5) + 0x30));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&usedNames,__x);
  }
  local_134 = 0;
  __k = localVars.
        super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (__k == localVars.
               super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&usedNames);
      std::
      _Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ::~_Vector_base(&localVars.
                       super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                     );
      return;
    }
    if (1 < __k->object->role - mutableLocal) break;
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    if ((__k->object->name).name == (string *)0x0) {
      std::__cxx11::to_string(&local_50,local_134);
      local_134 = local_134 + 1;
      std::__cxx11::string::operator=((string *)&name,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      Identifier::toString_abi_cxx11_(&__k->object->name);
      std::__cxx11::string::_M_assign((string *)&name);
      if (name._M_string_length == 0) {
        throwInternalCompilerError("! name.empty()","buildLocalVariableList",0x15c);
      }
      local_c0.usedNames = &usedNames;
      local_c0.this = this;
      std::__cxx11::string::string((string *)&local_b0,(string *)&name);
      __val = 2;
      while( true ) {
        bVar3 = buildLocalVariableList::anon_class_16_2_a56975aa::operator()(&local_c0,&local_b0);
        if (!bVar3) break;
        std::operator+(&local_70,&name,"_");
        std::__cxx11::to_string(&local_90,__val);
        std::operator+(&local_50,&local_70,&local_90);
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        __val = __val + 1;
      }
      std::__cxx11::string::operator=((string *)&name,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&usedNames,&name);
    }
    pmVar4 = std::__detail::
             _Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->localVariableNames,__k);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&name);
    __k = __k + 1;
  }
  throwInternalCompilerError
            ("v->isMutableLocal() || v->isConstant()","buildLocalVariableList",0x156);
}

Assistant:

void buildLocalVariableList (const heart::Function& f)
        {
            int unnamedVariableIndex = 0;
            localVariableNames.clear();
            auto localVars = f.getAllLocalVariables();
            std::vector<std::string> usedNames;
            usedNames.reserve (localVars.size());

            for (auto& v : f.parameters)
                usedNames.push_back (v->name.toString());

            for (auto& v : localVars)
            {
                SOUL_ASSERT (v->isMutableLocal() || v->isConstant());
                std::string name;

                if (v->name.isValid())
                {
                    name = v->name.toString();
                    SOUL_ASSERT (! name.empty());
                    name = addSuffixToMakeUnique (name, [&] (const std::string& nm) { return contains (usedNames, nm)
                                                                                              || contains (allVisibleVariables, nm); });
                    usedNames.push_back (name);
                }
                else
                {
                    name = std::to_string (unnamedVariableIndex++);
                }

                localVariableNames[v] = name;
            }
        }